

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Parser
XML_ExternalEntityParserCreate(XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  XML_Bool XVar1;
  DTD *oldDtd_00;
  XML_StartElementHandler p_Var2;
  XML_Memory_Handling_Suite *pXVar3;
  NAMED **ppNVar4;
  XML_ProcessingInstructionHandler p_Var5;
  XML_CommentHandler p_Var6;
  XML_StartCdataSectionHandler p_Var7;
  XML_Memory_Handling_Suite *pXVar8;
  BLOCK *pBVar9;
  XML_UnparsedEntityDeclHandler p_Var10;
  XML_NotationDeclHandler p_Var11;
  XML_Memory_Handling_Suite *pXVar12;
  BLOCK *pBVar13;
  BLOCK *pBVar14;
  XML_ExternalEntityRefHandler p_Var15;
  XML_SkippedEntityHandler p_Var16;
  XML_Memory_Handling_Suite *pXVar17;
  XML_ElementDeclHandler p_Var18;
  XML_AttlistDeclHandler p_Var19;
  BINDING *pBVar20;
  XML_XmlDeclHandler p_Var21;
  ELEMENT_TYPE *pEVar22;
  NAMED **ppNVar23;
  NAMED **ppNVar24;
  XML_Parser pXVar25;
  XML_Bool XVar26;
  int iVar27;
  XML_Char local_11a [2];
  XML_Memory_Handling_Suite *pXStack_118;
  XML_Char tmp [2];
  unsigned_long oldhash_secret_salt;
  XML_Bool oldns_triplets;
  XML_Parser oldExternalEntityRefHandlerArg;
  XML_Bool oldDefaultExpandInternalEntities;
  void *oldHandlerArg;
  void *oldUserData;
  ELEMENT_TYPE *oldDeclElementType;
  XML_XmlDeclHandler oldXmlDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler;
  XML_ElementDeclHandler oldElementDeclHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler;
  XML_SkippedEntityHandler oldSkippedEntityHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler;
  XML_DefaultHandler oldDefaultHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler;
  XML_CommentHandler oldCommentHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler;
  XML_CharacterDataHandler oldCharacterDataHandler;
  XML_EndElementHandler oldEndElementHandler;
  XML_StartElementHandler oldStartElementHandler;
  DTD *oldDtd;
  DTD *newDtd;
  XML_Parser parser;
  XML_Char *encodingName_local;
  XML_Char *context_local;
  XML_Parser oldParser_local;
  
  if (oldParser != (XML_Parser)0x0) {
    oldDtd_00 = oldParser->m_dtd;
    p_Var2 = oldParser->m_startElementHandler;
    pXVar3 = (XML_Memory_Handling_Suite *)oldParser->m_endElementHandler;
    ppNVar4 = (NAMED **)oldParser->m_characterDataHandler;
    p_Var5 = oldParser->m_processingInstructionHandler;
    p_Var6 = oldParser->m_commentHandler;
    p_Var7 = oldParser->m_startCdataSectionHandler;
    pXVar8 = (XML_Memory_Handling_Suite *)oldParser->m_endCdataSectionHandler;
    pBVar9 = (BLOCK *)oldParser->m_defaultHandler;
    p_Var10 = oldParser->m_unparsedEntityDeclHandler;
    p_Var11 = oldParser->m_notationDeclHandler;
    pXVar12 = (XML_Memory_Handling_Suite *)oldParser->m_startNamespaceDeclHandler;
    pBVar13 = (BLOCK *)oldParser->m_endNamespaceDeclHandler;
    pBVar14 = (BLOCK *)oldParser->m_notStandaloneHandler;
    p_Var15 = oldParser->m_externalEntityRefHandler;
    p_Var16 = oldParser->m_skippedEntityHandler;
    pXVar17 = (XML_Memory_Handling_Suite *)oldParser->m_unknownEncodingHandler;
    p_Var18 = oldParser->m_elementDeclHandler;
    p_Var19 = oldParser->m_attlistDeclHandler;
    pBVar20 = (BINDING *)oldParser->m_entityDeclHandler;
    p_Var21 = oldParser->m_xmlDeclHandler;
    pEVar22 = oldParser->m_declElementType;
    ppNVar23 = (NAMED **)oldParser->m_userData;
    ppNVar24 = (NAMED **)oldParser->m_handlerArg;
    XVar26 = oldParser->m_defaultExpandInternalEntities;
    pXVar25 = oldParser->m_externalEntityRefHandlerArg;
    XVar1 = oldParser->m_ns_triplets;
    pXStack_118 = (XML_Memory_Handling_Suite *)oldParser->m_hash_secret_salt;
    if (oldParser->m_ns == '\0') {
      newDtd = (DTD *)parserCreate(encodingName,&oldParser->m_mem,(XML_Char *)0x0,(DTD *)0x0);
    }
    else {
      local_11a[0] = oldParser->m_namespaceSeparator;
      local_11a[1] = 0;
      newDtd = (DTD *)parserCreate(encodingName,&oldParser->m_mem,local_11a,(DTD *)0x0);
    }
    if (newDtd != (DTD *)0x0) {
      (newDtd->attributeIds).used = (size_t)p_Var2;
      (newDtd->attributeIds).mem = pXVar3;
      (newDtd->prefixes).v = ppNVar4;
      *(XML_ProcessingInstructionHandler *)&(newDtd->prefixes).power = p_Var5;
      (newDtd->prefixes).size = (size_t)p_Var6;
      (newDtd->prefixes).used = (size_t)p_Var7;
      (newDtd->prefixes).mem = pXVar8;
      (newDtd->pool).blocks = pBVar9;
      (newDtd->pool).ptr = (XML_Char *)p_Var10;
      (newDtd->pool).start = (XML_Char *)p_Var11;
      (newDtd->pool).mem = pXVar12;
      (newDtd->entityValuePool).blocks = pBVar13;
      (newDtd->entityValuePool).freeBlocks = pBVar14;
      (newDtd->entityValuePool).end = (XML_Char *)p_Var15;
      (newDtd->entityValuePool).start = (XML_Char *)p_Var16;
      (newDtd->entityValuePool).mem = pXVar17;
      *(XML_ElementDeclHandler *)&newDtd->keepProcessing = p_Var18;
      (newDtd->defaultPrefix).name = (XML_Char *)p_Var19;
      (newDtd->defaultPrefix).binding = pBVar20;
      *(XML_XmlDeclHandler *)&newDtd->in_eldecl = p_Var21;
      *(ELEMENT_TYPE **)&newDtd[1].scaffCount = pEVar22;
      (newDtd->generalEntities).v = ppNVar23;
      if (ppNVar23 == ppNVar24) {
        *(NAMED ***)&(newDtd->generalEntities).power = (newDtd->generalEntities).v;
      }
      else {
        *(DTD **)&(newDtd->generalEntities).power = newDtd;
      }
      if (pXVar25 != oldParser) {
        (newDtd->entityValuePool).ptr = (XML_Char *)pXVar25;
      }
      *(XML_Bool *)&newDtd[1].entityValuePool.start = XVar26;
      newDtd[1].prefixes.field_0x9 = XVar1;
      newDtd[2].entityValuePool.mem = pXStack_118;
      newDtd[2].entityValuePool.ptr = (XML_Char *)oldParser;
      iVar27 = dtdCopy(oldParser,*(DTD **)&newDtd[2].generalEntities.power,oldDtd_00,
                       (XML_Memory_Handling_Suite *)&(newDtd->generalEntities).used);
      if ((iVar27 != 0) && (XVar26 = setContext((XML_Parser)newDtd,context), XVar26 != '\0')) {
        newDtd[1].pool.ptr = (XML_Char *)externalEntityInitProcessor;
        return (XML_Parser)newDtd;
      }
      XML_ParserFree((XML_Parser)newDtd);
    }
  }
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XMLCALL
XML_ExternalEntityParserCreate(XML_Parser oldParser, const XML_Char *context,
                               const XML_Char *encodingName) {
  XML_Parser parser = oldParser;
  DTD *newDtd = NULL;
  DTD *oldDtd;
  XML_StartElementHandler oldStartElementHandler;
  XML_EndElementHandler oldEndElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler;
  XML_CommentHandler oldCommentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler;
  XML_SkippedEntityHandler oldSkippedEntityHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler;
  ELEMENT_TYPE *oldDeclElementType;

  void *oldUserData;
  void *oldHandlerArg;
  XML_Bool oldDefaultExpandInternalEntities;
  XML_Parser oldExternalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing;
  int oldInEntityValue;
#endif
  XML_Bool oldns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  unsigned long oldhash_secret_salt;

  /* Validate the oldParser parameter before we pull everything out of it */
  if (oldParser == NULL)
    return NULL;

  /* Stash the original parser contents on the stack */
  oldDtd = parser->m_dtd;
  oldStartElementHandler = parser->m_startElementHandler;
  oldEndElementHandler = parser->m_endElementHandler;
  oldCharacterDataHandler = parser->m_characterDataHandler;
  oldProcessingInstructionHandler = parser->m_processingInstructionHandler;
  oldCommentHandler = parser->m_commentHandler;
  oldStartCdataSectionHandler = parser->m_startCdataSectionHandler;
  oldEndCdataSectionHandler = parser->m_endCdataSectionHandler;
  oldDefaultHandler = parser->m_defaultHandler;
  oldUnparsedEntityDeclHandler = parser->m_unparsedEntityDeclHandler;
  oldNotationDeclHandler = parser->m_notationDeclHandler;
  oldStartNamespaceDeclHandler = parser->m_startNamespaceDeclHandler;
  oldEndNamespaceDeclHandler = parser->m_endNamespaceDeclHandler;
  oldNotStandaloneHandler = parser->m_notStandaloneHandler;
  oldExternalEntityRefHandler = parser->m_externalEntityRefHandler;
  oldSkippedEntityHandler = parser->m_skippedEntityHandler;
  oldUnknownEncodingHandler = parser->m_unknownEncodingHandler;
  oldElementDeclHandler = parser->m_elementDeclHandler;
  oldAttlistDeclHandler = parser->m_attlistDeclHandler;
  oldEntityDeclHandler = parser->m_entityDeclHandler;
  oldXmlDeclHandler = parser->m_xmlDeclHandler;
  oldDeclElementType = parser->m_declElementType;

  oldUserData = parser->m_userData;
  oldHandlerArg = parser->m_handlerArg;
  oldDefaultExpandInternalEntities = parser->m_defaultExpandInternalEntities;
  oldExternalEntityRefHandlerArg = parser->m_externalEntityRefHandlerArg;
#ifdef XML_DTD
  oldParamEntityParsing = parser->m_paramEntityParsing;
  oldInEntityValue = parser->m_prologState.inEntityValue;
#endif
  oldns_triplets = parser->m_ns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  oldhash_secret_salt = parser->m_hash_secret_salt;

#ifdef XML_DTD
  if (! context)
    newDtd = oldDtd;
#endif /* XML_DTD */

  /* Note that the magical uses of the pre-processor to make field
     access look more like C++ require that `parser' be overwritten
     here.  This makes this function more painful to follow than it
     would be otherwise.
  */
  if (parser->m_ns) {
    XML_Char tmp[2] = {parser->m_namespaceSeparator, 0};
    parser = parserCreate(encodingName, &parser->m_mem, tmp, newDtd);
  } else {
    parser = parserCreate(encodingName, &parser->m_mem, NULL, newDtd);
  }

  if (! parser)
    return NULL;

  parser->m_startElementHandler = oldStartElementHandler;
  parser->m_endElementHandler = oldEndElementHandler;
  parser->m_characterDataHandler = oldCharacterDataHandler;
  parser->m_processingInstructionHandler = oldProcessingInstructionHandler;
  parser->m_commentHandler = oldCommentHandler;
  parser->m_startCdataSectionHandler = oldStartCdataSectionHandler;
  parser->m_endCdataSectionHandler = oldEndCdataSectionHandler;
  parser->m_defaultHandler = oldDefaultHandler;
  parser->m_unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  parser->m_notationDeclHandler = oldNotationDeclHandler;
  parser->m_startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  parser->m_endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  parser->m_notStandaloneHandler = oldNotStandaloneHandler;
  parser->m_externalEntityRefHandler = oldExternalEntityRefHandler;
  parser->m_skippedEntityHandler = oldSkippedEntityHandler;
  parser->m_unknownEncodingHandler = oldUnknownEncodingHandler;
  parser->m_elementDeclHandler = oldElementDeclHandler;
  parser->m_attlistDeclHandler = oldAttlistDeclHandler;
  parser->m_entityDeclHandler = oldEntityDeclHandler;
  parser->m_xmlDeclHandler = oldXmlDeclHandler;
  parser->m_declElementType = oldDeclElementType;
  parser->m_userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    parser->m_handlerArg = parser->m_userData;
  else
    parser->m_handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    parser->m_externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  parser->m_defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  parser->m_ns_triplets = oldns_triplets;
  parser->m_hash_secret_salt = oldhash_secret_salt;
  parser->m_parentParser = oldParser;
#ifdef XML_DTD
  parser->m_paramEntityParsing = oldParamEntityParsing;
  parser->m_prologState.inEntityValue = oldInEntityValue;
  if (context) {
#endif /* XML_DTD */
    if (! dtdCopy(oldParser, parser->m_dtd, oldDtd, &parser->m_mem)
        || ! setContext(parser, context)) {
      XML_ParserFree(parser);
      return NULL;
    }
    parser->m_processor = externalEntityInitProcessor;
#ifdef XML_DTD
  } else {
    /* The DTD instance referenced by parser->m_dtd is shared between the
       document's root parser and external PE parsers, therefore one does not
       need to call setContext. In addition, one also *must* not call
       setContext, because this would overwrite existing prefix->binding
       pointers in parser->m_dtd with ones that get destroyed with the external
       PE parser. This would leave those prefixes with dangling pointers.
    */
    parser->m_isParamEntity = XML_TRUE;
    XmlPrologStateInitExternalEntity(&parser->m_prologState);
    parser->m_processor = externalParEntInitProcessor;
  }
#endif /* XML_DTD */
  return parser;
}